

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::ZeroObjColSingletonPS::ZeroObjColSingletonPS
          (ZeroObjColSingletonPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *param_3,int _j,int _i,shared_ptr<soplex::Tolerances> *tols)

{
  int iVar1;
  undefined4 in_ECX;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_ffffffffffffff00;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined8 in_stack_ffffffffffffff08;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  PostStep *in_stack_ffffffffffffff20;
  
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_ffffffffffffff00,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3fdfba);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x3fdfd0);
  PostStep::PostStep(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                     (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),(int)in_stack_ffffffffffffff08)
  ;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x3fe00a);
  *in_RDI = &PTR__ZeroObjColSingletonPS_0089b748;
  *(undefined4 *)(in_RDI + 5) = in_ECX;
  *(undefined4 *)((long)in_RDI + 0x2c) = in_R8D;
  iVar1 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x3fe043);
  *(int *)(in_RDI + 6) = iVar1 + -1;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::lhs(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffff00,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::rhs(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffff00,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::lower(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffff00,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::upper(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_ffffffffffffff00,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  this_00 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)(in_RDI + 0x23);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::rowVector(this_00,in_stack_fffffffffffffefc);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this_00,
             (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  return;
}

Assistant:

ZeroObjColSingletonPS(const SPxLPBase<R>& lp, const SPxMainSM&, int _j, int _i,
                            std::shared_ptr<Tolerances> tols)
         : PostStep("ZeroObjColSingleton", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_i(_i)
         , m_old_j(lp.nCols() - 1)
         , m_lhs(lp.lhs(_i))
         , m_rhs(lp.rhs(_i))
         , m_lower(lp.lower(_j))
         , m_upper(lp.upper(_j))
         , m_row(lp.rowVector(_i))
      {}